

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlastsame_s.c
# Opt level: O0

errno_t strlastsame_s(char *dest,rsize_t dmax,char *src,rsize_t *index)

{
  long lVar1;
  bool bVar2;
  ulong *in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  _Bool similarity;
  char *rp;
  errno_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  char *in_stack_ffffffffffffffc8;
  char *local_28;
  ulong local_20;
  char *local_18;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RCX == (ulong *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffc8,
               (void *)CONCAT17(in_stack_ffffffffffffffc7,
                                CONCAT16(in_stack_ffffffffffffffc6,
                                         CONCAT24(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0))),
               in_stack_ffffffffffffffbc);
    local_c = 400;
  }
  else {
    *in_RCX = 0;
    if (in_RDI == (char *)0x0) {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffc8,
                 (void *)CONCAT17(in_stack_ffffffffffffffc7,
                                  CONCAT16(in_stack_ffffffffffffffc6,
                                           CONCAT24(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0))),
                 in_stack_ffffffffffffffbc);
      local_c = 400;
    }
    else if (in_RDX == (char *)0x0) {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffc8,
                 (void *)CONCAT17(in_stack_ffffffffffffffc7,
                                  CONCAT16(in_stack_ffffffffffffffc6,
                                           CONCAT24(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0))),
                 in_stack_ffffffffffffffbc);
      local_c = 400;
    }
    else if (in_RSI == 0) {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffc8,
                 (void *)CONCAT17(in_stack_ffffffffffffffc7,
                                  CONCAT16(in_stack_ffffffffffffffc6,
                                           CONCAT24(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0))),
                 in_stack_ffffffffffffffbc);
      local_c = 0x191;
    }
    else if (in_RSI < 0x10000001) {
      bVar2 = false;
      local_28 = in_RDX;
      local_20 = in_RSI;
      local_18 = in_RDI;
      while( true ) {
        bVar3 = false;
        if ((*local_18 != '\0') && (bVar3 = false, *local_28 != '\0')) {
          bVar3 = local_20 != 0;
        }
        if (!bVar3) break;
        if (*local_18 == *local_28) {
          bVar2 = true;
          *in_RCX = (ulong)(uint)((int)local_18 - (int)in_RDI);
        }
        local_18 = local_18 + 1;
        local_28 = local_28 + 1;
        local_20 = local_20 - 1;
      }
      if (bVar2) {
        local_c = 0;
      }
      else {
        local_c = 0x199;
      }
    }
    else {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffc8,
                 (void *)CONCAT17(in_stack_ffffffffffffffc7,
                                  CONCAT16(in_stack_ffffffffffffffc6,
                                           CONCAT24(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0))),
                 in_stack_ffffffffffffffbc);
      local_c = 0x193;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
strlastsame_s (const char *dest, rsize_t dmax,
               const char *src, rsize_t *index)
{
    const char *rp;
    bool similarity;

    if (index == NULL) {
        invoke_safe_str_constraint_handler("strlastsame_s: index is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }
    *index = 0;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strlastsame_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strlastsame_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0 ) {
        invoke_safe_str_constraint_handler("strlastsame_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strlastsame_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /* hold reference point */
    rp = dest;

    /*
     * find the last offset
     */
    similarity = false;
    while (*dest && *src && dmax) {

        if (*dest == *src) {
            similarity = true;
            *index = (uint32_t)(dest - rp);
        }

        dest++;
        src++;
        dmax--;
    }

    if (similarity) {
        return (EOK);
    } else {
        return (ESNOTFND);
    }
}